

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaPValAttrBlockFinal
              (xmlChar *value,int *flags,int flagAll,int flagExtension,int flagRestriction,
              int flagSubstitution,int flagList,int flagUnion)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  xmlChar *str1;
  long lVar6;
  uint uVar7;
  
  if (value == (xmlChar *)0x0 || flags == (int *)0x0) {
    uVar7 = 0xffffffff;
  }
  else if (*value == '\0') {
    uVar7 = 0;
  }
  else {
    iVar3 = xmlStrEqual(value,(xmlChar *)"#all");
    if (iVar3 == 0) {
      uVar7 = 0;
      do {
        while ((uVar5 = (ulong)*value, uVar5 < 0x21 && ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0)))
        {
          value = value + 1;
        }
        lVar6 = 0;
        while ((0x20 < (byte)uVar5 || ((0x100002601U >> (uVar5 & 0x3f) & 1) == 0))) {
          lVar2 = lVar6 + 1;
          lVar6 = lVar6 + 1;
          uVar5 = (ulong)value[lVar2];
        }
        if (lVar6 == 0) {
          return 0;
        }
        str1 = xmlStrndup(value,(int)lVar6);
        iVar3 = xmlStrEqual(str1,(xmlChar *)"extension");
        if (iVar3 == 0) {
          iVar3 = xmlStrEqual(str1,(xmlChar *)"restriction");
          if (iVar3 == 0) {
            iVar3 = xmlStrEqual(str1,(xmlChar *)"substitution");
            if (iVar3 == 0) {
              iVar3 = xmlStrEqual(str1,"list");
              if (iVar3 == 0) {
                iVar3 = xmlStrEqual(str1,"union");
                bVar1 = false;
                if ((flagList != -1) && (iVar3 != 0)) {
                  bVar1 = true;
                  if ((flagList & *flags) == 0) {
                    uVar4 = *flags | flagList;
                    goto LAB_0018b66f;
                  }
                }
              }
              else {
                if (flagSubstitution == -1) goto LAB_0018b6cf;
                bVar1 = true;
                if ((*flags & flagSubstitution) == 0) {
                  uVar4 = *flags | flagSubstitution;
                  goto LAB_0018b66f;
                }
              }
            }
            else if (flagRestriction == -1) {
LAB_0018b6cf:
              bVar1 = false;
            }
            else {
              bVar1 = true;
              if ((*flags & flagRestriction) == 0) {
                uVar4 = *flags | flagRestriction;
                goto LAB_0018b66f;
              }
            }
          }
          else {
            bVar1 = true;
            if ((flagExtension & *flags) == 0) {
              uVar4 = *flags | flagExtension;
              goto LAB_0018b66f;
            }
          }
        }
        else {
          if (flagAll == -1) goto LAB_0018b6cf;
          bVar1 = true;
          if ((*flags & flagAll) == 0) {
            uVar4 = *flags | flagAll;
LAB_0018b66f:
            *flags = uVar4;
            bVar1 = true;
          }
        }
        if (str1 != (xmlChar *)0x0) {
          (*xmlFree)(str1);
        }
        if (!bVar1) {
          return 1;
        }
        value = value + lVar6;
      } while (*value != 0);
    }
    else {
      uVar7 = 0;
      if (flagAll == -1) {
        flagAll = uVar7;
      }
      if (flagRestriction == -1) {
        flagRestriction = uVar7;
      }
      if (flagSubstitution == -1) {
        flagSubstitution = 0;
      }
      uVar4 = flagSubstitution | flagRestriction | flagExtension | flagAll | *flags;
      *flags = uVar4;
      if (flagList != -1) {
        *flags = uVar4 | flagList;
        uVar7 = 0;
      }
    }
  }
  return uVar7;
}

Assistant:

static int
xmlSchemaPValAttrBlockFinal(const xmlChar *value,
			    int *flags,
			    int flagAll,
			    int flagExtension,
			    int flagRestriction,
			    int flagSubstitution,
			    int flagList,
			    int flagUnion)
{
    int ret = 0;

    /*
    * TODO: This does not check for duplicate entries.
    */
    if ((flags == NULL) || (value == NULL))
	return (-1);
    if (value[0] == 0)
	return (0);
    if (xmlStrEqual(value, BAD_CAST "#all")) {
	if (flagAll != -1)
	    *flags |= flagAll;
	else {
	    if (flagExtension != -1)
		*flags |= flagExtension;
	    if (flagRestriction != -1)
		*flags |= flagRestriction;
	    if (flagSubstitution != -1)
		*flags |= flagSubstitution;
	    if (flagList != -1)
		*flags |= flagList;
	    if (flagUnion != -1)
		*flags |= flagUnion;
	}
    } else {
	const xmlChar *end, *cur = value;
	xmlChar *item;

	do {
	    while (IS_BLANK_CH(*cur))
		cur++;
	    end = cur;
	    while ((*end != 0) && (!(IS_BLANK_CH(*end))))
		end++;
	    if (end == cur)
		break;
	    item = xmlStrndup(cur, end - cur);
	    if (xmlStrEqual(item, BAD_CAST "extension")) {
		if (flagExtension != -1) {
		    if ((*flags & flagExtension) == 0)
			*flags |= flagExtension;
		} else
		    ret = 1;
	    } else if (xmlStrEqual(item, BAD_CAST "restriction")) {
		if (flagRestriction != -1) {
		    if ((*flags & flagRestriction) == 0)
			*flags |= flagRestriction;
		} else
		    ret = 1;
	    } else if (xmlStrEqual(item, BAD_CAST "substitution")) {
		if (flagSubstitution != -1) {
		    if ((*flags & flagSubstitution) == 0)
			*flags |= flagSubstitution;
		} else
		    ret = 1;
	    } else if (xmlStrEqual(item, BAD_CAST "list")) {
		if (flagList != -1) {
		    if ((*flags & flagList) == 0)
			*flags |= flagList;
		} else
		    ret = 1;
	    } else if (xmlStrEqual(item, BAD_CAST "union")) {
		if (flagUnion != -1) {
		    if ((*flags & flagUnion) == 0)
			*flags |= flagUnion;
		} else
		    ret = 1;
	    } else
		ret = 1;
	    if (item != NULL)
		xmlFree(item);
	    cur = end;
	} while ((ret == 0) && (*cur != 0));
    }

    return (ret);
}